

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

prof_dump_hook_t duckdb_je_prof_dump_hook_get(void)

{
  void *result;
  
  return (prof_dump_hook_t)duckdb_je_prof_dump_hook.repr;
}

Assistant:

prof_dump_hook_t
prof_dump_hook_get(void) {
	return (prof_dump_hook_t)atomic_load_p(&prof_dump_hook,
	    ATOMIC_ACQUIRE);
}